

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char  [7] __thiscall
kj::str<kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
          (kj *this,DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *params)

{
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *value;
  String local_30;
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *local_18;
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *params_local;
  
  local_18 = params;
  params_local = (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)this;
  value = fwd<kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>(params);
  toCharSequence<kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>((kj *)&local_30,value);
  _::concat((String *)this,&local_30);
  String::~String(&local_30);
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}